

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this,
          int opcode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Kind KVar2;
  Kind kind;
  long *plVar3;
  ExprPrinter *pEVar4;
  char *pcVar5;
  int iVar6;
  LogicalExpr condition;
  NumericExpr then_expr;
  NumericExpr else_expr;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
  local_1e8;
  NumericExpr local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  NumericExpr local_168;
  string local_148;
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  NumericExpr local_c8;
  long *local_a8 [2];
  long local_98 [2];
  Expr local_88;
  NumericExpr local_68;
  Reference local_48;
  
  KVar2 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar2) {
  case IF:
    ReadLogicalExpr_abi_cxx11_(&local_1e8.lhs,this);
    plVar3 = *(long **)this;
    pcVar5 = (char *)*plVar3;
    plVar3[3] = (long)pcVar5;
    *plVar3 = (long)(pcVar5 + 1);
    ReadNumericExpr_abi_cxx11_(&local_1a8,this,*pcVar5,false);
    plVar3 = *(long **)this;
    pcVar5 = (char *)*plVar3;
    plVar3[3] = (long)pcVar5;
    *plVar3 = (long)(pcVar5 + 1);
    ReadNumericExpr_abi_cxx11_(&local_168,this,*pcVar5,false);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_168._M_dataplus._M_p,
               local_168._M_dataplus._M_p + local_168._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_1e8.rhs.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
    local_1e8.rhs._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_0012830c:
      operator_delete(local_1e8.rhs._M_dataplus._M_p,local_1e8.rhs.field_2._M_allocated_capacity + 1
                     );
    }
    goto LAB_00128314;
  case PLTERM:
    iVar6 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      (*(BinaryReader<mp::internal::IdentityConverter> **)this);
    if (iVar6 < 2) {
      local_1e8.lhs._M_dataplus._M_p = (pointer)0x0;
      local_1e8.lhs._M_string_length = 0;
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      local_1a8._M_string_length = (size_type)&local_1e8;
      BinaryReaderBase::ReportError
                (*(BinaryReaderBase **)this,(CStringRef)0x139f33,(ArgList *)&local_1a8);
    }
    else {
      iVar6 = iVar6 + -1;
      do {
        plVar3 = *(long **)this;
        pcVar5 = (char *)*plVar3;
        plVar3[3] = (long)pcVar5;
        *plVar3 = (long)(pcVar5 + 1);
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
        ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                      *)this,*pcVar5);
        plVar3 = *(long **)this;
        pcVar5 = (char *)*plVar3;
        plVar3[3] = (long)pcVar5;
        *plVar3 = (long)(pcVar5 + 1);
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
        ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                      *)this,*pcVar5);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    plVar3 = *(long **)this;
    pcVar5 = (char *)*plVar3;
    plVar3[3] = (long)pcVar5;
    *plVar3 = (long)(pcVar5 + 1);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::ReadConstant
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *
               )this,*pcVar5);
    ReadReference_abi_cxx11_(&local_48,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_c8.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
    local_c8._M_dataplus._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00128327;
  case CALL:
  case LAST_VARARG:
switchD_00127da3_caseD_29:
    local_1e8.lhs._M_dataplus._M_p = (pointer)0x0;
    local_1e8.lhs._M_string_length = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = (size_type)&local_1e8;
    BinaryReaderBase::ReportError
              (*(BinaryReaderBase **)this,(CStringRef)0x139f5b,(ArgList *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_0012823d;
  case FIRST_ITERATED:
    iVar6 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    goto LAB_00128229;
  case SUM:
    iVar6 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,3);
    paVar1 = &local_1e8.lhs.field_2;
    local_1e8.lhs.field_2._8_8_ = 0;
    local_1e8.lhs._M_string_length = 0;
    local_1e8.lhs.field_2._M_allocated_capacity = 0;
    local_1e8.lhs._M_dataplus._M_p = (pointer)paVar1;
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::NumericExprReader,ExprPrinter::NumericArgHandler>
              (this,iVar6,(NumericArgHandler *)&local_1e8);
    pEVar4 = *(ExprPrinter **)(this + 0x10);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    ExprPrinter::format<std::__cxx11::string>(__return_storage_ptr__,pEVar4,"sum({})",&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    local_c8.field_2._M_allocated_capacity = local_1e8.lhs.field_2._M_allocated_capacity;
    local_c8._M_dataplus._M_p = local_1e8.lhs._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.lhs._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_00128327;
  case LAST_ITERATED:
    iVar6 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    plVar3 = *(long **)this;
    pcVar5 = (char *)*plVar3;
    plVar3[3] = (long)pcVar5;
    *plVar3 = (long)(pcVar5 + 1);
    ReadNumericExpr_abi_cxx11_(&local_68,this,*pcVar5,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
LAB_00128229:
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar6,(ArgHandler *)&local_1e8);
    break;
  case NUMBEROF_SYM:
    iVar6 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    ReadSymbolicExpr_abi_cxx11_(&local_88,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar6 + -1,(ArgHandler *)&local_1e8);
    break;
  case COUNT:
    iVar6 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar6,(ArgHandler *)&local_1e8);
    break;
  default:
    kind = OpCodeInfo::INFO[opcode].kind;
    if (KVar2 != ADD) {
      if (KVar2 == FIRST_UNARY) {
        plVar3 = *(long **)this;
        pEVar4 = *(ExprPrinter **)(this + 0x10);
        pcVar5 = (char *)*plVar3;
        plVar3[3] = (long)pcVar5;
        *plVar3 = (long)(pcVar5 + 1);
        ReadNumericExpr_abi_cxx11_(&local_c8,this,*pcVar5,false);
        ExprPrinter::OnUnary(__return_storage_ptr__,pEVar4,kind,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_00128327;
      }
      goto switchD_00127da3_caseD_29;
    }
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
    ::BinaryArgReader(&local_1e8,
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                       *)this);
    pEVar4 = *(ExprPrinter **)(this + 0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_1e8.rhs._M_dataplus._M_p,
               local_1e8.rhs._M_dataplus._M_p + local_1e8.rhs._M_string_length);
    ExprPrinter::OnBinary(__return_storage_ptr__,pEVar4,kind,&local_128,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.rhs._M_dataplus._M_p != &local_1e8.rhs.field_2) goto LAB_0012830c;
LAB_00128314:
    local_c8.field_2._M_allocated_capacity = local_1e8.lhs.field_2._M_allocated_capacity;
    local_c8._M_dataplus._M_p = local_1e8.lhs._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.lhs._M_dataplus._M_p == &local_1e8.lhs.field_2) {
      return __return_storage_ptr__;
    }
LAB_00128327:
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
LAB_0012823d:
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}